

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawrend.cpp
# Opt level: O0

void __thiscall CGL::DrawRend::move_view(DrawRend *this,float dx,float dy,float zoom)

{
  double dVar1;
  reference this_00;
  double *pdVar2;
  float fVar3;
  float y;
  float x;
  float span;
  Matrix3x3 *m;
  float zoom_local;
  float dy_local;
  float dx_local;
  DrawRend *this_local;
  
  this_00 = std::vector<CGL::Matrix3x3,_std::allocator<CGL::Matrix3x3>_>::operator[]
                      (&this->svg_to_ndc,this->current_svg);
  pdVar2 = Matrix3x3::operator()(this_00,2,2);
  fVar3 = (float)(*pdVar2 / 2.0);
  pdVar2 = Matrix3x3::operator()(this_00,0,2);
  dVar1 = *pdVar2;
  pdVar2 = Matrix3x3::operator()(this_00,1,2);
  set_view(this,(float)((double)fVar3 - dVar1) - dx,(float)((double)fVar3 - *pdVar2) - dy,
           fVar3 * zoom);
  return;
}

Assistant:

void DrawRend::move_view(float dx, float dy, float zoom) {
  Matrix3x3& m = svg_to_ndc[current_svg];
  float span = m(2,2)/2.;
  float x = span - m(0,2), y = span - m(1,2);
  set_view(x - dx, y - dy, span * zoom);
}